

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O2

void PrintInstruction(InstructionVMGraphContext *ctx,VmInstruction *instruction)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  SynBase *pSVar5;
  char *pcVar6;
  TypeBase *pTVar7;
  VmValue *pVVar8;
  VmValue *value;
  VmInstruction *instruction_00;
  undefined4 extraout_EAX;
  int iVar9;
  ulong uVar10;
  byte *pbVar11;
  VmValue **ppVVar12;
  uint uVar13;
  uint i;
  uint uVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  if (((ctx->showSource == true) &&
      (pSVar5 = (instruction->super_VmValue).source, pSVar5 != (SynBase *)0x0)) &&
     (pSVar5->isInternal == false)) {
    pcVar18 = (pSVar5->pos).begin;
    pcVar6 = pcVar18;
    uVar14 = 0;
    do {
      uVar13 = uVar14;
      pcVar17 = pcVar6;
      pcVar15 = pcVar18;
      if ((pcVar17 <= ctx->code) || (pcVar17[-1] == '\r')) break;
      pcVar6 = pcVar17 + -1;
      uVar14 = uVar13 + 1;
    } while (pcVar17[-1] != '\n');
    do {
      do {
        pbVar11 = (byte *)(pcVar15 + 1);
        pcVar15 = pcVar15 + 1;
      } while (0xd < *pbVar11);
    } while ((0x2401U >> (*pbVar11 & 0x1f) & 1) == 0);
    if (ctx->showAnnotatedSource == true) {
      uVar20 = (int)pcVar18 - (int)pcVar17;
      uVar10 = (long)(pSVar5->pos).end - (long)pcVar17;
      uVar14 = (uint)uVar10;
      if (((pcVar17 != ctx->lastStart) || (uVar20 != ctx->lastStartOffset)) ||
         (uVar14 != ctx->lastEndOffset)) {
        Print(ctx,"// %.*s");
        PrintLine(ctx);
        PrintIndent(ctx);
        if ((((instruction->super_VmValue).source)->pos).end < pcVar15) {
          Print(ctx,"// ");
          uVar16 = (ulong)uVar13;
          for (uVar19 = 0; uVar16 != uVar19; uVar19 = uVar19 + 1) {
            Print(ctx," ");
            if (pcVar17[uVar19] == '\t') {
              pcVar18 = "   ";
              if (uVar19 == 0) {
                pcVar18 = "  ";
              }
              Print(ctx,pcVar18);
            }
          }
          for (; uVar16 < (uVar10 & 0xffffffff); uVar16 = uVar16 + 1) {
            Print(ctx,"~");
            if (pcVar17[uVar16] == '\t') {
              pcVar18 = "~~~";
              if (uVar16 == 0) {
                pcVar18 = "~~";
              }
              Print(ctx,pcVar18);
            }
          }
          PrintLine(ctx);
          PrintIndent(ctx);
        }
        ctx->lastStart = pcVar17;
        ctx->lastStartOffset = uVar20;
        ctx->lastEndOffset = uVar14;
      }
    }
    else if (pcVar17 != ctx->lastStart) {
      Print(ctx,"// %.*s");
      PrintLine(ctx);
      PrintIndent(ctx);
      ctx->lastStart = pcVar17;
    }
  }
  PrintUsers(ctx,&instruction->super_VmValue,false);
  if (((instruction->super_VmValue).type.type != VM_TYPE_VOID) ||
     ((instruction->super_VmValue).type.size != 0)) {
    if (ctx->showTypes == true) {
      PrintType(ctx,(instruction->super_VmValue).type);
      Print(ctx," ");
    }
    Print(ctx,"%%%d",(ulong)instruction->uniqueId);
    if (instruction->color != 0) {
      Print(ctx,".c%d");
    }
    if ((instruction->regVmRegisters).count != 0) {
      Print(ctx,".r");
      for (uVar14 = 0; uVar14 < (instruction->regVmRegisters).count; uVar14 = uVar14 + 1) {
        pcVar18 = "|%d";
        if (uVar14 == 0) {
          pcVar18 = "%d";
        }
        pbVar11 = SmallArray<unsigned_char,_8U>::operator[](&instruction->regVmRegisters,uVar14);
        Print(ctx,pcVar18,(ulong)*pbVar11);
      }
    }
    if (ctx->showComments == true) {
      pcVar18 = (instruction->super_VmValue).comment.begin;
      pcVar6 = (instruction->super_VmValue).comment.end;
      if (pcVar18 != pcVar6) {
        Print(ctx," (%.*s)",(ulong)(uint)((int)pcVar6 - (int)pcVar18));
      }
    }
    if (ctx->showFullTypes == true) {
      pTVar7 = (instruction->super_VmValue).type.structType;
      if (pTVar7 == (TypeBase *)0x0) {
        Print(ctx," <");
        PrintType(ctx,(instruction->super_VmValue).type);
        Print(ctx,">");
      }
      else {
        Print(ctx," <%.*s>",(ulong)(uint)(*(int *)&(pTVar7->name).end - (int)(pTVar7->name).begin));
      }
    }
    Print(ctx," = ");
  }
  pcVar18 = GetInstructionName(instruction);
  Print(ctx,"%s",pcVar18);
  if (instruction->cmd == VM_INST_PHI) {
    Print(ctx," [");
    for (uVar14 = 0; uVar14 < (instruction->arguments).count; uVar14 = uVar14 + 2) {
      ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,uVar14);
      pVVar8 = *ppVVar12;
      ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,uVar14 + 1);
      value = *ppVVar12;
      if (uVar14 != 0) {
        Print(ctx,", ");
      }
      PrintName(ctx,pVVar8,false,false);
      Print(ctx," from ");
      PrintName(ctx,value,false,false);
    }
    Print(ctx,"]");
  }
  else {
    if (ctx->displayAsTree != false) {
      uVar1 = (instruction->super_VmValue).type.type;
      uVar3 = (instruction->super_VmValue).type.size;
      auVar21._4_4_ = -(uint)(uVar1 == 0);
      auVar21._0_4_ = -(uint)(uVar1 == 0);
      auVar21._8_4_ = -(uint)(uVar3 == 0);
      auVar21._12_4_ = -(uint)(uVar3 == 0);
      iVar9 = movmskpd(extraout_EAX,auVar21);
      if (iVar9 == 3) {
        Print(ctx," // %%%d",(ulong)instruction->uniqueId);
      }
      PrintLine(ctx);
      ctx->depth = ctx->depth + 1;
      for (uVar14 = 0; uVar14 < (instruction->arguments).count; uVar14 = uVar14 + 1) {
        ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,uVar14);
        instruction_00 = (VmInstruction *)*ppVVar12;
        PrintIndent(ctx);
        if (((instruction_00 == (VmInstruction *)0x0) ||
            ((instruction_00->super_VmValue).typeID != 2)) ||
           ((instruction_00->super_VmValue).users.count == 0)) {
          PrintName(ctx,(VmValue *)instruction_00,false,false);
          PrintLine(ctx);
        }
        else {
          PrintInstruction(ctx,instruction_00);
        }
      }
      ctx->depth = ctx->depth - 1;
      return;
    }
    for (uVar14 = 0; uVar14 < (instruction->arguments).count; uVar14 = uVar14 + 1) {
      ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,uVar14);
      pVVar8 = *ppVVar12;
      pcVar18 = ", ";
      if (uVar14 == 0) {
        pcVar18 = " ";
      }
      Print(ctx,pcVar18);
      PrintName(ctx,pVVar8,false,false);
    }
    uVar2 = (instruction->super_VmValue).type.type;
    uVar4 = (instruction->super_VmValue).type.size;
    auVar22._4_4_ = -(uint)(uVar2 == 0);
    auVar22._0_4_ = -(uint)(uVar2 == 0);
    auVar22._8_4_ = -(uint)(uVar4 == 0);
    auVar22._12_4_ = -(uint)(uVar4 == 0);
    iVar9 = movmskpd(0x333de0,auVar22);
    if (iVar9 == 3) {
      Print(ctx," // %%%d",(ulong)instruction->uniqueId);
    }
  }
  PrintLine(ctx);
  return;
}

Assistant:

void PrintInstruction(InstructionVMGraphContext &ctx, VmInstruction *instruction)
{
	if(ctx.showSource && instruction->source && !instruction->source->isInternal)
	{
		const char *start = instruction->source->pos.begin;
		const char *end = start + 1;

		// TODO: handle source locations from imported modules
		while(start > ctx.code && *(start - 1) != '\r' && *(start - 1) != '\n')
			start--;

		while(*end && *end != '\r' && *end != '\n')
			end++;

		if (ctx.showAnnotatedSource)
		{
			unsigned startOffset = unsigned(instruction->source->pos.begin - start);
			unsigned endOffset = unsigned(instruction->source->pos.end - start);

			if(start != ctx.lastStart || startOffset != ctx.lastStartOffset || endOffset != ctx.lastEndOffset)
			{
				Print(ctx, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx);
				PrintIndent(ctx);

				if (instruction->source->pos.end < end)
				{
					Print(ctx, "// ");

					for (unsigned i = 0; i < startOffset; i++)
					{
						Print(ctx, " ");

						if (start[i] == '\t')
							Print(ctx, i == 0 ? "  " : "   ");
					}

					for (unsigned i = startOffset; i < endOffset; i++)
					{
						Print(ctx, "~");

						if (start[i] == '\t')
							Print(ctx, i == 0 ? "~~" : "~~~");
					}

					PrintLine(ctx);
					PrintIndent(ctx);
				}

				ctx.lastStart = start;
				ctx.lastStartOffset = startOffset;
				ctx.lastEndOffset = endOffset;
			}
		}
		else
		{
			if(start != ctx.lastStart)
			{
				Print(ctx, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx);
				PrintIndent(ctx);

				ctx.lastStart = start;
			}
		}
	}

	PrintUsers(ctx, instruction, false);

	if(instruction->type != VmType::Void)
	{
		if(ctx.showTypes)
		{
			PrintType(ctx, instruction->type);
			Print(ctx, " ");
		}

		Print(ctx, "%%%d", instruction->uniqueId);

		if(instruction->color)
			Print(ctx, ".c%d", instruction->color);

		if(!instruction->regVmRegisters.empty())
		{
			Print(ctx, ".r");

			for(unsigned i = 0; i < instruction->regVmRegisters.size(); i++)
				Print(ctx, i == 0 ? "%d" : "|%d", instruction->regVmRegisters[i]);
		}

		if(ctx.showComments && !instruction->comment.empty())
			Print(ctx, " (%.*s)", FMT_ISTR(instruction->comment));

		if (ctx.showFullTypes)
		{
			if (instruction->type.structType)
			{
				Print(ctx, " <%.*s>", FMT_ISTR(instruction->type.structType->name));
			}
			else
			{
				Print(ctx, " <");
				PrintType(ctx, instruction->type);
				Print(ctx, ">");
			}
		}

		Print(ctx, " = ");
	}

	Print(ctx, "%s", GetInstructionName(instruction));

	if(instruction->cmd == VM_INST_PHI)
	{
		Print(ctx, " [");

		for(unsigned i = 0; i < instruction->arguments.size(); i += 2)
		{
			VmValue *value = instruction->arguments[i];
			VmValue *edge = instruction->arguments[i + 1];

			if(i != 0)
				Print(ctx, ", ");

			PrintName(ctx, value, false, false);
			Print(ctx, " from ");
			PrintName(ctx, edge, false, false);
		}

		Print(ctx, "]");
		PrintLine(ctx);

		return;
	}

	if(ctx.displayAsTree)
	{
		if(instruction->type == VmType::Void)
			Print(ctx, " // %%%d", instruction->uniqueId);

		PrintLine(ctx);

		ctx.depth++;

		for(unsigned i = 0; i < instruction->arguments.size(); i++)
		{
			VmValue *value = instruction->arguments[i];

			PrintIndent(ctx);

			VmInstruction *inst = getType<VmInstruction>(value);

			if(inst && !inst->users.empty())
			{
				PrintInstruction(ctx, inst);
			}
			else
			{
				PrintName(ctx, value, false, false);
				PrintLine(ctx);
			}
		}

		ctx.depth--;
	}
	else
	{
		for(unsigned i = 0; i < instruction->arguments.size(); i++)
		{
			VmValue *value = instruction->arguments[i];

			if(i == 0)
				Print(ctx, " ");
			else
				Print(ctx, ", ");

			PrintName(ctx, value, false, false);
		}

		if(instruction->type == VmType::Void)
			Print(ctx, " // %%%d", instruction->uniqueId);

		PrintLine(ctx);
	}
}